

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

int HandleRequestWithPreloaded
              (CP_Services Svcs,Evpath_RS_Stream RS_Stream,int Rank,size_t Timestep,size_t Offset,
              size_t Length,void *Buffer)

{
  code *pcVar1;
  undefined8 uVar2;
  uint64_t uVar3;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_R8;
  size_t in_R9;
  bool bVar4;
  void *in_stack_00000008;
  RSTimestepList Entry;
  long *local_40;
  uint local_4;
  
  local_40 = *(long **)(in_RSI + 0x60);
  while( true ) {
    bVar4 = false;
    if ((local_40 != (long *)0x0) && (bVar4 = true, (int)local_40[1] == in_EDX)) {
      bVar4 = *local_40 != in_RCX;
    }
    if (!bVar4) break;
    local_40 = (long *)local_40[5];
  }
  if (local_40 != (long *)0x0) {
    pcVar1 = (code *)*in_RDI;
    uVar2 = *(undefined8 *)(in_RSI + 8);
    uVar3 = writeBlockFingerprint((char *)local_40[2],local_40[3]);
    (*pcVar1)(uVar2,5,
              "Satisfying remote memory read with preload from writer rank %d for timestep %ld, fprint %lx\n"
              ,in_EDX,in_RCX,uVar3);
    memcpy(in_stack_00000008,(void *)(local_40[2] + in_R8),in_R9);
  }
  local_4 = (uint)(local_40 != (long *)0x0);
  return local_4;
}

Assistant:

static int HandleRequestWithPreloaded(CP_Services Svcs, Evpath_RS_Stream RS_Stream, int Rank,
                                      size_t Timestep, size_t Offset, size_t Length, void *Buffer)
{
    RSTimestepList Entry = NULL;
    Entry = RS_Stream->QueuedTimesteps;
    while (Entry && ((Entry->WriterRank != Rank) || (Entry->Timestep != Timestep)))
    {
        Entry = Entry->Next;
    }
    if (!Entry)
    {
        return 0;
    }
    Svcs->verbose(RS_Stream->CP_Stream, DPTraceVerbose,
                  "Satisfying remote memory read with preload from writer rank "
                  "%d for timestep %ld, fprint %lx\n",
                  Rank, Timestep, writeBlockFingerprint(Entry->Data, Entry->DataSize));
    memcpy(Buffer, Entry->Data + Offset, Length);
    return 1;
}